

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

bool __thiscall units::measurement::operator<=(measurement *this,measurement *other)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  dVar4 = value_as(other,&this->units_);
  bVar1 = true;
  if (dVar4 < this->value_) {
    fVar3 = (float)this->value_;
    fVar5 = (float)dVar4;
    fVar6 = fVar3 - fVar5;
    if (((fVar6 != 0.0) || (NAN(fVar6))) &&
       ((NAN(fVar6) || ((uint)ABS(fVar6) < 0x7f800001 && ((uint)fVar6 & 0x7f800000) != 0)))) {
      fVar6 = (float)((int)fVar3 + 8U & 0xfffffff0);
      fVar7 = (float)((int)fVar5 + 8U & 0xfffffff0);
      if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
        fVar2 = (float)((int)(fVar5 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar6 != fVar2) || (NAN(fVar6) || NAN(fVar2))) {
          fVar5 = (float)((int)(fVar5 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar6 != fVar5) || (NAN(fVar6) || NAN(fVar5))) {
            fVar5 = (float)((int)(fVar3 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar7 != fVar5) || (NAN(fVar7) || NAN(fVar5))) {
              bVar1 = (bool)(-(fVar7 == (float)((int)(fVar3 * 0.9999995) + 8U & 0xfffffff0)) & 1);
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool operator<=(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ <= val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }